

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_coin.cpp
# Opt level: O2

int CfdGetSelectedCoinIndex
              (void *handle,void *coin_select_handle,uint32_t index,int32_t *utxo_index)

{
  vector<int,_std::allocator<int>_> *this;
  pointer piVar1;
  pointer piVar2;
  value_type vVar3;
  reference pvVar4;
  CfdException *pCVar5;
  allocator local_49;
  undefined1 local_48 [32];
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)local_48,"CoinSelection",&local_49);
  cfd::capi::CheckBuffer(coin_select_handle,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  if (utxo_index == (int32_t *)0x0) {
    local_48._0_8_ = "cfdcapi_coin.cpp";
    local_48._8_4_ = 0x1f1;
    local_48._16_8_ = "CfdGetSelectedCoinIndex";
    cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"utxo index is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)local_48,"Failed to parameter. utxo index is null.",&local_49);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)local_48);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  this = *(vector<int,_std::allocator<int>_> **)((long)coin_select_handle + 0x88);
  if (this != (vector<int,_std::allocator<int>_> *)0x0) {
    piVar1 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if (piVar1 != piVar2) {
      if ((ulong)index < (ulong)((long)piVar2 - (long)piVar1 >> 2)) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::at(this,(ulong)index);
        vVar3 = *pvVar4;
      }
      else {
        vVar3 = -1;
      }
      *utxo_index = vVar3;
      return 0;
    }
  }
  local_48._0_8_ = "cfdcapi_coin.cpp";
  local_48._8_4_ = 0x1fa;
  local_48._16_8_ = "CfdGetSelectedCoinIndex";
  cfd::core::logger::warn<>((CfdSourceLocation *)local_48,"select coin list is empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)local_48,"Failed to parameter. select coin list is empty.",&local_49);
  cfd::core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)local_48);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSelectedCoinIndex(
    void* handle, void* coin_select_handle, uint32_t index,
    int32_t* utxo_index) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(coin_select_handle, kPrefixCoinSelection);
    if (utxo_index == nullptr) {
      warn(CFD_LOG_SOURCE, "utxo index is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to parameter. utxo index is null.");
    }

    CfdCapiCoinSelection* buffer =
        static_cast<CfdCapiCoinSelection*>(coin_select_handle);
    if ((buffer->indexes == nullptr) || buffer->indexes->empty()) {
      warn(CFD_LOG_SOURCE, "select coin list is empty.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "Failed to parameter. select coin list is empty.");
    } else if (index >= buffer->indexes->size()) {
      *utxo_index = -1;
    } else {
      *utxo_index = buffer->indexes->at(index);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}